

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

Box * __thiscall
amrex::BoxArray::minimalBox(Box *__return_storage_ptr__,BoxArray *this,Long *npts_avg_box)

{
  IntVect *pIVar1;
  undefined8 uVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  int iVar12;
  int dir;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  IntVect IVar18;
  int local_54 [3];
  long *local_48;
  int local_40 [3];
  
  (__return_storage_ptr__->smallend).vect[0] = 1;
  (__return_storage_ptr__->smallend).vect[1] = 1;
  (__return_storage_ptr__->smallend).vect[2] = 1;
  __return_storage_ptr__->bigend = (int  [3])0x0;
  __return_storage_ptr__->btype = 0;
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar11 = *(undefined8 **)
             &(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data;
  uVar16 = (int)((long)*(pointer *)
                        ((long)&(peVar3->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) - (long)puVar11 >> 2) * -0x49249249;
  local_48 = npts_avg_box;
  if ((int)uVar16 < 1) {
    lVar17 = 0;
  }
  else {
    uVar2 = *puVar11;
    uVar4 = puVar11[1];
    uVar5 = *(undefined8 *)((long)puVar11 + 0x14);
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)((long)puVar11 + 0xc);
    *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar5;
    *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar2;
    *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar4;
    lVar17 = (long)((*(int *)((long)puVar11 + 0x14) - *(int *)(puVar11 + 1)) + 1) *
             (long)(((int)*(undefined8 *)((long)puVar11 + 0xc) - (int)*puVar11) + 1) *
             (long)(((int)((ulong)*(undefined8 *)((long)puVar11 + 0xc) >> 0x20) -
                    (int)((ulong)*puVar11 >> 0x20)) + 1);
    if (uVar16 != 1) {
      lVar10 = (ulong)(uVar16 & 0x7fffffff) - 1;
      lVar9 = 0x1c;
      do {
        Box::minBox(__return_storage_ptr__,(Box *)((long)puVar11 + lVar9));
        puVar11 = *(undefined8 **)
                   &(((this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
        uVar2 = *(undefined8 *)((long)puVar11 + lVar9 + 0xc);
        lVar17 = lVar17 + (long)((*(int *)((long)puVar11 + lVar9 + 0x14) -
                                 *(int *)((long)puVar11 + lVar9 + 8)) + 1) *
                          (long)(((int)uVar2 - (int)*(undefined8 *)((long)puVar11 + lVar9)) + 1) *
                          (long)(((int)((ulong)uVar2 >> 0x20) -
                                 (int)((ulong)*(undefined8 *)((long)puVar11 + lVar9) >> 0x20)) + 1);
        lVar9 = lVar9 + 0x1c;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
  }
  pIVar1 = &__return_storage_ptr__->bigend;
  IVar18 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar8 = IVar18.vect[2];
  local_40[0] = IVar18.vect[0];
  local_40[1] = IVar18.vect[1];
  local_40[2] = IVar18.vect[2];
  iVar12 = IVar18.vect[0];
  iVar15 = IVar18.vect[1];
  if (IVar18.vect._0_8_ >> 0x20 == 1 && iVar12 == 1) {
    if (iVar8 == 1) goto LAB_0054cd2d;
    uVar6 = (__return_storage_ptr__->smallend).vect[1];
  }
  else {
    uVar6 = (__return_storage_ptr__->smallend).vect[0];
    if (iVar12 != 1) {
      if (iVar12 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar12 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar12);
      }
      else {
        uVar6 = (int)uVar6 / iVar12;
      }
    }
    (__return_storage_ptr__->smallend).vect[0] = uVar6;
    uVar6 = (__return_storage_ptr__->smallend).vect[1];
    if (iVar15 != 1) {
      if (iVar15 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar15 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar15);
      }
      else {
        uVar6 = (int)uVar6 / iVar15;
      }
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar6;
  uVar6 = (__return_storage_ptr__->smallend).vect[2];
  if (iVar8 != 1) {
    if (iVar8 == 4) {
      if ((int)uVar6 < 0) {
        uVar6 = (int)uVar6 >> 2;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (iVar8 == 2) {
      if ((int)uVar6 < 0) {
        uVar6 = (int)uVar6 >> 1;
      }
      else {
        uVar6 = uVar6 >> 1;
      }
    }
    else if ((int)uVar6 < 0) {
      uVar6 = ~((int)~uVar6 / iVar8);
    }
    else {
      uVar6 = (int)uVar6 / iVar8;
    }
  }
  (__return_storage_ptr__->smallend).vect[2] = uVar6;
  uVar6 = (__return_storage_ptr__->btype).itype;
  if (uVar6 == 0) {
    uVar6 = pIVar1->vect[0];
    if (iVar12 != 1) {
      if (iVar12 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar12 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar12);
      }
      else {
        uVar6 = (int)uVar6 / iVar12;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar6;
    uVar6 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar15 != 1) {
      if (iVar15 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar15 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar15);
      }
      else {
        uVar6 = (int)uVar6 / iVar15;
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar6;
    uVar6 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar8 != 1) {
      if (iVar8 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar8 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar8);
      }
      else {
        uVar6 = (int)uVar6 / iVar8;
      }
    }
  }
  else {
    local_54[0] = 0;
    local_54[1] = 0;
    local_54[2] = 0;
    lVar9 = 0;
    do {
      if (((uVar6 >> ((uint)lVar9 & 0x1f) & 1) != 0) && (pIVar1->vect[lVar9] % local_40[lVar9] != 0)
         ) {
        local_54[lVar9] = 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    uVar7 = pIVar1->vect[0];
    if (iVar12 != 1) {
      if (iVar12 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar12 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar12);
      }
      else {
        uVar7 = (int)uVar7 / iVar12;
      }
    }
    uVar13 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar15 != 1) {
      if (iVar15 == 4) {
        if ((int)uVar13 < 0) {
          uVar13 = (int)uVar13 >> 2;
        }
        else {
          uVar13 = uVar13 >> 2;
        }
      }
      else if (iVar15 == 2) {
        if ((int)uVar13 < 0) {
          uVar13 = (int)uVar13 >> 1;
        }
        else {
          uVar13 = uVar13 >> 1;
        }
      }
      else if ((int)uVar13 < 0) {
        uVar13 = ~((int)~uVar13 / iVar15);
      }
      else {
        uVar13 = (int)uVar13 / iVar15;
      }
    }
    uVar6 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar8 != 1) {
      if (iVar8 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar8 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar8);
      }
      else {
        uVar6 = (int)uVar6 / iVar8;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar7 + local_54[0];
    (__return_storage_ptr__->bigend).vect[1] = uVar13 + local_54[1];
    uVar6 = uVar6 + local_54[2];
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar6;
LAB_0054cd2d:
  uVar6 = 0;
  switch((this->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar6 = *(uint *)&(this->m_bat).m_op;
    break;
  default:
    uVar6 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  uVar7 = (__return_storage_ptr__->btype).itype;
  lVar9 = 0;
  do {
    uVar14 = 1 << ((byte)lVar9 & 0x1f);
    uVar13 = (uint)lVar9;
    pIVar1->vect[lVar9] =
         (pIVar1->vect[lVar9] + (uint)((uVar6 >> (uVar13 & 0x1f) & 1) != 0)) -
         (uint)((uVar7 >> (uVar13 & 0x1f) & 1) != 0);
    if ((uVar6 >> (uVar13 & 0x1f) & 1) == 0) {
      uVar7 = ~uVar14 & (__return_storage_ptr__->btype).itype;
    }
    else {
      uVar7 = uVar14 | (__return_storage_ptr__->btype).itype;
    }
    (__return_storage_ptr__->btype).itype = uVar7;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  *local_48 = (lVar17 / (long)(iVar8 * iVar12 * iVar15)) / (long)(int)uVar16;
  return __return_storage_ptr__;
}

Assistant:

Box
BoxArray::minimalBox (Long& npts_avg_box) const
{
    BL_ASSERT(m_bat.is_simple());
    Box minbox;
    const int N = size();
    Long npts_tot = 0;
    if (N > 0)
    {
#ifdef AMREX_USE_OMP
        bool use_single_thread = omp_in_parallel();
        const int nthreads = use_single_thread ? 1 : omp_get_max_threads();
#else
        bool use_single_thread = true;
        const int nthreads = 1;
#endif
        if (use_single_thread)
        {
            minbox = m_ref->m_abox[0];
            npts_tot += m_ref->m_abox[0].numPts();
            for (int i = 1; i < N; ++i) {
                minbox.minBox(m_ref->m_abox[i]);
                npts_tot += m_ref->m_abox[i].numPts();
            }
        }
        else
        {
            Vector<Box> bxs(nthreads, m_ref->m_abox[0]);
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(+:npts_tot)
#endif
            {
                int tid = OpenMP::get_thread_num();
#ifdef AMREX_USE_OMP
#pragma omp for
#endif
                for (int i = 0; i < N; ++i) {
                    bxs[tid].minBox(m_ref->m_abox[i]);
                    Long npts = m_ref->m_abox[i].numPts();
                    npts_tot += npts;
                }
            }
            minbox = bxs[0];
            for (int i = 1; i < nthreads; ++i) {
                minbox.minBox(bxs[i]);
            }
        }
    }
    auto cr = crseRatio();
    minbox.coarsen(cr).convert(ixType());
    npts_tot /= AMREX_D_TERM(cr[0],*cr[1],*cr[2]);
    npts_avg_box = npts_tot / N;
    return minbox;
}